

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statistics_helper.cpp
# Opt level: O3

RelationStats *
duckdb::RelationStatisticsHelper::ExtractProjectionStats
          (RelationStats *__return_storage_ptr__,LogicalProjection *proj,RelationStats *child_stats)

{
  pointer *ppDVar1;
  pointer puVar2;
  undefined8 uVar3;
  int iVar4;
  pointer pEVar5;
  type expr;
  ulong uVar6;
  pointer pDVar7;
  DistinctCount *__args;
  iterator iVar8;
  pointer this;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  undefined4 uVar12;
  ExpressionBinding res;
  DistinctCount local_78;
  undefined1 local_68 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  RelationStats *local_38;
  
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->filter_strength = 1.0;
  __return_storage_ptr__->stats_initialized = false;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->table_name).field_2;
  (__return_storage_ptr__->table_name)._M_string_length = 0;
  (__return_storage_ptr__->table_name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->cardinality = child_stats->cardinality;
  local_38 = child_stats;
  (*(proj->super_LogicalOperator)._vptr_LogicalOperator[3])(&local_58);
  ::std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->table_name,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  this = (proj->super_LogicalOperator).expressions.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (proj->super_LogicalOperator).expressions.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this != puVar2) {
    do {
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this);
      (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[7])(&local_58,pEVar5);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->column_names,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(this);
      GetChildColumnBinding((ExpressionBinding *)&local_58,expr);
      uVar3 = local_58.field_2._M_allocated_capacity;
      if (local_58.field_2._M_local_buf[8] == '\x01') {
        local_78.distinct_count = (idx_t)&DAT_00000001;
        local_78.from_hll = true;
        iVar8._M_current =
             (__return_storage_ptr__->column_distinct_count).
             super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (__return_storage_ptr__->column_distinct_count).
            super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
          _M_realloc_insert<duckdb::DistinctCount>
                    ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                     __return_storage_ptr__,iVar8,&local_78);
        }
        else {
          (iVar8._M_current)->distinct_count = 1;
          *(ulong *)&(iVar8._M_current)->from_hll = CONCAT44(local_78._12_4_,local_78._8_4_);
          ppDVar1 = &(__return_storage_ptr__->column_distinct_count).
                     super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                     super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
        goto LAB_017449e1;
      }
      pDVar7 = (local_38->column_distinct_count).
               super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
               super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(local_38->column_distinct_count).
                    super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                    super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar7 >> 4;
      if (local_58.field_2._M_allocated_capacity < uVar6) {
LAB_01744950:
        if ((ulong)uVar3 < uVar6) {
          __args = pDVar7 + uVar3;
          iVar8._M_current =
               (__return_storage_ptr__->column_distinct_count).
               super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
               super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar8._M_current !=
              (__return_storage_ptr__->column_distinct_count).
              super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
              super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            uVar9 = (int)__args->distinct_count;
            uVar10 = *(undefined4 *)((long)&__args->distinct_count + 4);
            uVar11 = *(uint *)&__args->from_hll;
            uVar12 = *(undefined4 *)&__args->field_0xc;
            goto LAB_017449cf;
          }
          ::std::vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>>::
          _M_realloc_insert<duckdb::DistinctCount_const&>
                    ((vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>> *)
                     __return_storage_ptr__,iVar8,__args);
        }
        else {
          local_78.distinct_count = __return_storage_ptr__->cardinality;
          local_78._8_4_ = local_78._8_4_ & 0xffffff00;
          iVar8._M_current =
               (__return_storage_ptr__->column_distinct_count).
               super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
               super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar8._M_current !=
              (__return_storage_ptr__->column_distinct_count).
              super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
              super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_017449ca;
          ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
          _M_realloc_insert<duckdb::DistinctCount>
                    ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                     __return_storage_ptr__,iVar8,&local_78);
        }
      }
      else {
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this);
        (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[8])(&local_78,pEVar5);
        iVar4 = ::std::__cxx11::string::compare((char *)&local_78);
        if ((undefined1 *)local_78.distinct_count != local_68) {
          operator_delete((void *)local_78.distinct_count);
        }
        if (iVar4 != 0) {
          pDVar7 = (local_38->column_distinct_count).
                   super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                   super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = (long)(local_38->column_distinct_count).
                        super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                        super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar7 >> 4;
          goto LAB_01744950;
        }
        local_78.distinct_count = (idx_t)&DAT_00000001;
        local_78.from_hll = true;
        iVar8._M_current =
             (__return_storage_ptr__->column_distinct_count).
             super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (__return_storage_ptr__->column_distinct_count).
            super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
          _M_realloc_insert<duckdb::DistinctCount>
                    ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                     __return_storage_ptr__,iVar8,&local_78);
          goto LAB_017449e1;
        }
LAB_017449ca:
        uVar9 = (undefined4)local_78.distinct_count;
        uVar10 = local_78.distinct_count._4_4_;
        uVar11 = local_78._8_4_;
        uVar12 = local_78._12_4_;
LAB_017449cf:
        *(undefined4 *)&(iVar8._M_current)->distinct_count = uVar9;
        *(undefined4 *)((long)&(iVar8._M_current)->distinct_count + 4) = uVar10;
        *(uint *)&(iVar8._M_current)->from_hll = uVar11;
        *(undefined4 *)&(iVar8._M_current)->field_0xc = uVar12;
        ppDVar1 = &(__return_storage_ptr__->column_distinct_count).
                   super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                   super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
LAB_017449e1:
      this = this + 1;
    } while (this != puVar2);
  }
  __return_storage_ptr__->stats_initialized = true;
  return __return_storage_ptr__;
}

Assistant:

RelationStats RelationStatisticsHelper::ExtractProjectionStats(LogicalProjection &proj, RelationStats &child_stats) {
	auto proj_stats = RelationStats();
	proj_stats.cardinality = child_stats.cardinality;
	proj_stats.table_name = proj.GetName();
	for (auto &expr : proj.expressions) {
		proj_stats.column_names.push_back(expr->GetName());
		auto res = GetChildColumnBinding(*expr);
		D_ASSERT(res.found_expression);
		if (res.expression_is_constant) {
			proj_stats.column_distinct_count.push_back(DistinctCount({1, true}));
		} else {
			auto column_index = res.child_binding.column_index;
			if (column_index >= child_stats.column_distinct_count.size() && expr->ToString() == "count_star()") {
				// only one value for a count star
				proj_stats.column_distinct_count.push_back(DistinctCount({1, true}));
			} else {
				// TODO: add this back in
				//	D_ASSERT(column_index < stats.column_distinct_count.size());
				if (column_index < child_stats.column_distinct_count.size()) {
					proj_stats.column_distinct_count.push_back(child_stats.column_distinct_count.at(column_index));
				} else {
					proj_stats.column_distinct_count.push_back(DistinctCount({proj_stats.cardinality, false}));
				}
			}
		}
	}
	proj_stats.stats_initialized = true;
	return proj_stats;
}